

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDir::QDir(QDir *this,QString *path)

{
  long lVar1;
  QDirPrivate *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  Filters in_stack_00000048;
  SortFlags in_stack_0000004c;
  QDirPrivate *nameFilters_;
  QString *path_00;
  QDirPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  path_00 = in_RDI;
  operator_new(0x118);
  nameFilters_ = in_RSI;
  QList<QString>::QList((QList<QString> *)0x1165f2);
  operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  QFlags<QDir::Filter>::QFlags((QFlags<QDir::Filter> *)in_RDI,(Filter)((ulong)in_RSI >> 0x20));
  QDirPrivate::QDirPrivate
            (in_stack_ffffffffffffffd0,path_00,(QStringList *)nameFilters_,in_stack_0000004c,
             in_stack_00000048);
  QSharedDataPointer<QDirPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QDirPrivate> *)in_RDI,in_RSI);
  QList<QString>::~QList((QList<QString> *)0x116646);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDir::QDir(const QString &path) : d_ptr(new QDirPrivate(path))
{
}